

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O1

Node * __thiscall
TMap<FName,_FMenuDescriptor_*,_THashTraits<FName>,_TValueTraits<FMenuDescriptor_*>_>::NewKey
          (TMap<FName,_FMenuDescriptor_*,_THashTraits<FName>,_TValueTraits<FMenuDescriptor_*>_>
           *this,FName *key)

{
  Node *pNVar1;
  FName FVar2;
  undefined4 uVar3;
  Node *pNVar4;
  uint uVar5;
  Node *pNVar6;
  uint uVar7;
  Node *pNVar8;
  Node *pNVar9;
  Node *pNVar10;
  FName local_24;
  
  pNVar4 = this->Nodes;
  uVar5 = this->Size - 1;
  uVar7 = key->Index & uVar5;
  pNVar10 = pNVar4 + uVar7;
  pNVar6 = pNVar10->Next;
  if (pNVar6 == (Node *)0x1) {
    pNVar10->Next = (Node *)0x0;
  }
  else {
    pNVar1 = this->LastFree;
    do {
      pNVar8 = pNVar1 + -1;
      pNVar9 = (Node *)0x0;
      if (pNVar1 <= pNVar4) break;
      pNVar9 = pNVar8;
      pNVar1 = pNVar8;
    } while (pNVar8->Next != (Node *)0x1);
    this->LastFree = pNVar8;
    if (pNVar9 == (Node *)0x0) {
      Resize(this,this->Size * 2);
      pNVar4 = NewKey(this,&local_24);
    }
    else {
      uVar5 = uVar5 & (pNVar10->Pair).Key.Index;
      if (uVar5 == uVar7) {
        pNVar9->Next = pNVar6;
        pNVar4 = pNVar9;
        pNVar6 = pNVar9;
      }
      else {
        pNVar4 = pNVar4 + uVar5;
        do {
          pNVar6 = pNVar4;
          pNVar4 = pNVar6->Next;
        } while (pNVar4 != pNVar10);
        pNVar6->Next = pNVar9;
        (pNVar9->Pair).Value = (pNVar10->Pair).Value;
        FVar2.Index = (pNVar10->Pair).Key.Index;
        uVar3 = *(undefined4 *)&(pNVar10->Pair).field_0x4;
        pNVar9->Next = pNVar10->Next;
        (pNVar9->Pair).Key = (FName)FVar2.Index;
        *(undefined4 *)&(pNVar9->Pair).field_0x4 = uVar3;
        pNVar4 = (Node *)0x0;
        pNVar6 = pNVar10;
      }
      pNVar10->Next = pNVar4;
      pNVar10 = pNVar6;
    }
    if (pNVar9 == (Node *)0x0) {
      return pNVar4;
    }
  }
  this->NumUsed = this->NumUsed + 1;
  (pNVar10->Pair).Key.Index = key->Index;
  return pNVar10;
}

Assistant:

Node *NewKey(const KT key)
	{
		Node *mp = MainPosition(key);
		if (!mp->IsNil())
		{
			Node *othern;
			Node *n = GetFreePos();		/* get a free place */
			if (n == NULL)				/* cannot find a free place? */
			{
				Rehash();				/* grow table */
				return NewKey(key);		/* re-insert key into grown table */
			}
			othern = MainPosition(mp->Pair.Key);
			if (othern != mp)			/* is colliding node out of its main position? */
			{	/* yes; move colliding node into free position */
				while (othern->Next != mp)	/* find previous */
				{
					othern = othern->Next;
				}
				othern->Next = n;		/* redo the chain with 'n' in place of 'mp' */
				CopyNode(n, mp); /* copy colliding node into free pos. (mp->Next also goes) */
				mp->Next = NULL;		/* now 'mp' is free */
			}
			else						/* colliding node is in its own main position */
			{							/* new node will go into free position */
				n->Next = mp->Next;		/* chain new position */
				mp->Next = n;
				mp = n;
			}
		}
		else
		{
			mp->Next = NULL;
		}
		++NumUsed;
		::new(&mp->Pair.Key) KT(key);
		return mp;
	}